

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_sasl_response(SASL_RESPONSE_HANDLE sasl_response)

{
  SASL_RESPONSE_INSTANCE *sasl_response_instance;
  AMQP_VALUE result;
  SASL_RESPONSE_HANDLE sasl_response_local;
  
  if (sasl_response == (SASL_RESPONSE_HANDLE)0x0) {
    sasl_response_instance = (SASL_RESPONSE_INSTANCE *)0x0;
  }
  else {
    sasl_response_instance =
         (SASL_RESPONSE_INSTANCE *)amqpvalue_clone(sasl_response->composite_value);
  }
  return (AMQP_VALUE)sasl_response_instance;
}

Assistant:

AMQP_VALUE amqpvalue_create_sasl_response(SASL_RESPONSE_HANDLE sasl_response)
{
    AMQP_VALUE result;

    if (sasl_response == NULL)
    {
        result = NULL;
    }
    else
    {
        SASL_RESPONSE_INSTANCE* sasl_response_instance = (SASL_RESPONSE_INSTANCE*)sasl_response;
        result = amqpvalue_clone(sasl_response_instance->composite_value);
    }

    return result;
}